

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void * get_from_bucket(ecs_bucket_t *bucket,ecs_map_key_t key,ecs_size_t elem_size)

{
  int local_34;
  int32_t count;
  int32_t i;
  ecs_map_key_t *keys;
  ecs_size_t elem_size_local;
  ecs_map_key_t key_local;
  ecs_bucket_t *bucket_local;
  
  local_34 = 0;
  while( true ) {
    if (bucket->count <= local_34) {
      return (void *)0x0;
    }
    if (bucket->keys[local_34] == key) break;
    local_34 = local_34 + 1;
  }
  return (void *)((long)bucket->payload + (long)(elem_size * local_34));
}

Assistant:

static
void* get_from_bucket(
    ecs_bucket_t *bucket,
    ecs_map_key_t key,
    ecs_size_t elem_size)
{
    ecs_map_key_t *keys = bucket->keys;
    int32_t i, count = bucket->count;

    for (i = 0; i < count; i ++) {
        if (keys[i] == key) {
            return GET_ELEM(bucket->payload, elem_size, i);
        }
    }
    return NULL;
}